

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void __thiscall
Bitmap::drawBarcode(Bitmap *this,uint32_t y,uint32_t height,uint32_t value,double scale)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint x;
  ulong uVar11;
  uint8_t barcode [9];
  byte local_39 [9];
  
  if (height != 0) {
    uVar3 = BarcodeEan8::intToBarcode(value,local_39);
    if (uVar3 != 0) {
      uVar8 = (ulong)(((double)(&this->width)[this->orientation != Horizontally] * scale) /
                     (double)uVar3);
      iVar7 = (int)uVar8;
      x = (&this->width)[this->orientation != Horizontally] - uVar3 * iVar7 >> 1;
      uVar9 = 0;
      do {
        if (iVar7 != 0) {
          bVar1 = local_39[uVar9 >> 3];
          uVar11 = uVar8 & 0xffffffff;
          do {
            uVar4 = getPixelIndex(this,x,y);
            if (uVar4 < (uint)this->length) {
              bVar5 = (byte)uVar4 & 7;
              uVar10 = uVar4 + 7;
              if (-1 < (int)uVar4) {
                uVar10 = uVar4;
              }
              bVar2 = this->data[(int)uVar10 >> 3];
              bVar6 = (byte)(0x80 >> bVar5) | bVar2;
              if ((0x80U >> ((byte)uVar9 & 7) & (uint)bVar1) == 0) {
                bVar6 = (byte)(-0x81 >> bVar5) & bVar2;
              }
              this->data[(int)uVar10 >> 3] = bVar6;
            }
            x = x + 1;
            uVar4 = (int)uVar11 - 1;
            uVar11 = (ulong)uVar4;
          } while (uVar4 != 0);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar3);
    }
    duplicateLineDown(this,y,height - 1);
  }
  return;
}

Assistant:

void Bitmap::drawBarcode(const uint32_t y, const uint32_t height, const uint32_t value, double scale)
{
   if (height > 0)
   {
      uint8_t barcode[9];
      uint32_t barcodeLength;
      uint32_t scaleFactor;
      uint32_t cursor;
      uint32_t pixel;

      //get encode barcode
      barcodeLength = BarcodeEan8::intToBarcode(value, barcode);

      //calculate a scale factor
      uint32_t width = ((orientation == Orientation::Horizontally) ? this->width : this->height);
      scaleFactor = (uint32_t)((scale * width) / barcodeLength);
      //calculate initial cursor position
      cursor = (width - (scaleFactor * barcodeLength)) / 2;

      //draw one barcode line
      for (uint32_t i = 0; i < barcodeLength; ++i)
      {
         bool value = ((barcode[i/8] & (0x80 >> (i & 7))) != 0); //get respective bit
         for (uint32_t j = 0; j < scaleFactor; ++j)
         {
            pixel = (uint32_t)getPixelIndex(cursor++, y);
            setPixelValue(pixel, value);
         }
      }

      //duplicate that line (height - 1)-times
      duplicateLineDown(y, height - 1);
   }
}